

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O0

bool Js::DateImplementation::UtcTimeFromStrCore
               (char16 *psz,uint ulength,double *retVal,ScriptContext *scriptContext)

{
  short *psVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  undefined4 *puVar9;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar10;
  size_t sizeInBytes;
  CharClassifier *this;
  char16 *pcVar11;
  undefined8 *puVar12;
  int local_15c;
  int local_158;
  int local_154;
  int local_14c;
  bool local_13a;
  bool local_139;
  int local_138;
  int local_134;
  int local_128;
  int local_124;
  bool local_120;
  bool local_11f;
  CharClassifier *classifier;
  bool isZeroPaddedYear;
  bool isNextFieldDateNegativeVersion5;
  bool isDateNegativeVersion5;
  size_t size;
  TrackAllocData local_e0;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_b8;
  ArenaAllocator *tempAllocator;
  TempArenaAllocatorObject *temptempAllocator;
  double tv;
  size_t numOfDigits;
  int local_90;
  int tBcAd;
  int tAmPm;
  bool fUtc;
  SZS *pszs;
  int32 ss;
  int32 lwOffset;
  int32 lwZone;
  int32 lwMillisecond;
  int32 lwTime;
  int32 lwDate;
  int32 lwMonth;
  int32 lwYear;
  int32 lwT;
  int32 depth;
  int32 cch;
  int32 lwNil;
  char16 *pszSrc;
  char16 *pcStack_40;
  char16 ch;
  char16 *pch;
  char16 *pchBase;
  ScriptContext *scriptContext_local;
  double *retVal_local;
  char16 *pcStack_18;
  uint ulength_local;
  char16 *psz_local;
  
  pchBase = (char16 *)scriptContext;
  scriptContext_local = (ScriptContext *)retVal;
  retVal_local._4_4_ = ulength;
  pcStack_18 = psz;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x3e1,"(scriptContext)","scriptContext");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (0x7ffffffe < retVal_local._4_4_) {
    return false;
  }
  if (pcStack_18 == (char16 *)0x0) {
    (scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo =
         (_func_int **)NumberConstants::NaN;
    return true;
  }
  bVar5 = TryParseIsoString(pcStack_18,(ulong)retVal_local._4_4_,(double *)scriptContext_local,
                            (ScriptContext *)pchBase);
  if (bVar5) {
    return true;
  }
  _cch = (char16_t *)0x0;
  depth = -0x80000000;
  lwDate = -0x80000000;
  lwTime = -0x80000000;
  lwMillisecond = -0x80000000;
  lwZone = -0x80000000;
  lwOffset = -0x80000000;
  ss = -0x80000000;
  pszs._4_4_ = -0x80000000;
  pszs._0_4_ = 0;
  local_90 = 0;
  numOfDigits._4_4_ = 0;
  tv = 0.0;
  temptempAllocator = (TempArenaAllocatorObject *)NumberConstants::NaN;
  tempAllocator =
       (ArenaAllocator *)
       ScriptContext::GetTemporaryAllocator((ScriptContext *)pchBase,L"UtcTimeFromStr");
  pAVar10 = &TempArenaAllocatorWrapper<false>::GetAllocator
                       ((TempArenaAllocatorWrapper<false> *)tempAllocator)->
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  local_b8 = pAVar10;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_e0,(type_info *)&char16_t::typeinfo,0,(ulong)(retVal_local._4_4_ + 1),
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
             ,0x421);
  pAVar10 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo(pAVar10,&local_e0);
  _cch = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                   ((Memory *)pAVar10,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                    (ulong)(retVal_local._4_4_ + 1));
  sizeInBytes = (ulong)(retVal_local._4_4_ + 1) << 1;
  js_memcpy_s(_cch,sizeInBytes,pcStack_18,sizeInBytes);
  _wcslwr_unsafe(_cch,(ulong)(retVal_local._4_4_ + 1));
  bVar3 = false;
  bVar5 = false;
  bVar4 = false;
  this = ScriptContext::GetCharClassifier((ScriptContext *)pchBase);
  pcStack_40 = _cch;
  pcVar11 = pcStack_40;
LAB_01071496:
  pcStack_40 = pcVar11;
  pszSrc._6_2_ = CharClassifier::SkipBiDirectionalChars(this,&stack0xffffffffffffffc0);
  puVar12 = _tAmPm;
  if (pszSrc._6_2_ != L'\0') {
    pcVar11 = pcStack_40 + 1;
    if (0x20 < (ushort)pszSrc._6_2_) {
      if (pszSrc._6_2_ != L'(') {
        if (pszSrc._6_2_ != L'+') {
          if (pszSrc._6_2_ == L',') goto LAB_01071496;
          if (pszSrc._6_2_ != L'-') {
            if ((pszSrc._6_2_ != L'/') && (pszSrc._6_2_ != L':')) {
              pch = pcStack_40;
              pcStack_40 = pcVar11;
              bVar6 = FBig(pszSrc._6_2_);
              if ((bVar6) || (iVar8 = isalpha((uint)(ushort)pszSrc._6_2_), iVar8 == 0)) {
                bVar6 = FBig(pszSrc._6_2_);
                puVar12 = _tAmPm;
                if ((!bVar6) &&
                   (iVar8 = isdigit((uint)(ushort)pszSrc._6_2_), puVar12 = _tAmPm, iVar8 != 0)) {
                  lwMonth = (ushort)pszSrc._6_2_ - 0x30;
                  do {
                    if ((((int)pszs != 4) && ((int)pszs != 5)) || (*pcStack_40 != L':')) {
                      bVar6 = FBig(*pcStack_40);
                      if ((bVar6) || (iVar8 = isdigit((uint)(ushort)*pcStack_40), iVar8 == 0))
                      goto LAB_01071a8f;
                      puVar12 = _tAmPm;
                      if (6 < (long)pcStack_40 - (long)pch >> 1) break;
                      lwMonth = lwMonth * 10 + (uint)(ushort)*pcStack_40 + -0x30;
                    }
                    pcStack_40 = pcStack_40 + 1;
                  } while( true );
                }
                goto LAB_01072523;
              }
              while( true ) {
                bVar7 = FBig(*pcStack_40);
                bVar6 = false;
                if (!bVar7) {
                  iVar8 = isalpha((uint)(ushort)*pcStack_40);
                  bVar6 = true;
                  if (iVar8 == 0) {
                    bVar6 = *pcStack_40 == L'.';
                  }
                }
                if (!bVar6) break;
                pcStack_40 = pcStack_40 + 1;
              }
              lwT = (int32)((long)pcStack_40 - (long)pch >> 1);
              if (pch[lwT + -1] == L'.') {
                lwT = lwT + -1;
              }
              while( true ) {
                local_11f = false;
                if (*pcStack_40 != L'\0') {
                  local_120 = true;
                  if (0x20 < (ushort)*pcStack_40) {
                    local_120 = CharClassifier::IsBiDirectionalChar(this,(uint)(ushort)*pcStack_40);
                  }
                  local_11f = local_120;
                }
                if (local_11f == false) break;
                pcStack_40 = pcStack_40 + 1;
              }
              if (lwT == 1) {
                if (bVar5) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 1;
                  bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                              ,0x472,"(isNextFieldDateNegativeVersion5 == false)",
                                              "isNextFieldDateNegativeVersion5 == false");
                  if (!bVar6) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 0;
                }
                puVar12 = _tAmPm;
                if (ss != -0x80000000) goto LAB_01072523;
                if ((ushort)pszSrc._6_2_ < 0x6e) {
                  if ((pszSrc._6_2_ == L'j') || ((ushort)pszSrc._6_2_ < 0x61)) goto LAB_01072523;
                  ss = (((ushort)pszSrc._6_2_ - 0x61) + (uint)((ushort)pszSrc._6_2_ < 0x6a)) * 0x3c;
                }
                else if ((ushort)pszSrc._6_2_ < 0x7a) {
                  ss = ((ushort)pszSrc._6_2_ - 0x6d) * -0x3c;
                }
                else {
                  if (pszSrc._6_2_ != L'z') goto LAB_01072523;
                  ss = 0;
                }
                if (*pcStack_40 == L'+') {
                  pcStack_40 = pcStack_40 + 1;
                  local_124 = 4;
                }
                else {
                  if (*pcStack_40 == L'-') {
                    pcStack_40 = pcStack_40 + 1;
                    local_128 = 5;
                  }
                  else {
                    local_128 = 0;
                  }
                  local_124 = local_128;
                }
                pszs._0_4_ = local_124;
                pcVar11 = pcStack_40;
              }
              else {
                _tAmPm = (undefined8 *)&ES5Array::vtable;
                do {
                  puVar12 = _tAmPm + -2;
                  if (_tAmPm < g_rgszs + 1) goto LAB_01072523;
                  psVar1 = (short *)(_tAmPm + -1);
                  _tAmPm = puVar12;
                } while ((*psVar1 < lwT) ||
                        (iVar8 = memcmp(pch,(void *)*puVar12,(long)lwT << 1), iVar8 != 0));
                puVar12 = _tAmPm;
                switch(*(undefined2 *)((long)_tAmPm + 10)) {
                case 0:
                  if (local_90 != 0) goto LAB_01072523;
                  local_90 = *(int *)((long)_tAmPm + 0xc);
                  break;
                case 1:
                  if (lwTime != -0x80000000) goto LAB_01072523;
                  lwTime = *(int32 *)((long)_tAmPm + 0xc);
                  if (*pcStack_40 == L'-') {
                    bVar3 = true;
                    pcStack_40 = pcStack_40 + 1;
                  }
                  break;
                case 3:
                  if (ss != -0x80000000) goto LAB_01072523;
                  ss = *(int32 *)((long)_tAmPm + 0xc);
                  if (*pcStack_40 == L'+') {
                    pcStack_40 = pcStack_40 + 1;
                    local_134 = 4;
                  }
                  else {
                    if (*pcStack_40 == L'-') {
                      pcStack_40 = pcStack_40 + 1;
                      local_138 = 5;
                    }
                    else {
                      local_138 = 0;
                    }
                    local_134 = local_138;
                  }
                  pszs._0_4_ = local_134;
                  break;
                case 4:
                  if (numOfDigits._4_4_ != 0) goto LAB_01072523;
                  numOfDigits._4_4_ = *(int *)((long)_tAmPm + 0xc);
                }
                pcVar11 = pcStack_40;
              }
            }
            goto LAB_01071496;
          }
        }
        pcStack_40 = pcVar11;
        if (lwZone == -0x80000000) goto LAB_01072523;
        pszs._0_4_ = 5;
        if (pszSrc._6_2_ == L'+') {
          pszs._0_4_ = 4;
        }
        goto LAB_01071496;
      }
      lwYear = 1;
      pcStack_40 = pcVar11;
      do {
        while( true ) {
          pszSrc._6_2_ = *pcStack_40;
          pcVar11 = pcStack_40;
          if (pszSrc._6_2_ == L'\0') goto LAB_01071496;
          pcStack_40 = pcStack_40 + 1;
          if (pszSrc._6_2_ != L'(') break;
          lwYear = lwYear + 1;
        }
      } while ((pszSrc._6_2_ != L')') || (lwYear = lwYear + -1, pcVar11 = pcStack_40, 0 < lwYear));
    }
    goto LAB_01071496;
  }
  if ((((lwDate != -0x80000000) && (lwTime != -0x80000000)) && (lwTime < 0xc)) &&
     ((lwMillisecond != -0x80000000 && (lwMillisecond < 0x20)))) {
    if (numOfDigits._4_4_ == 0) {
      if (((0x31 < lwDate) || (bVar3)) || (bVar4)) {
        if (((lwDate < 100) && (!bVar3)) && (!bVar4)) {
          lwDate = lwDate + 0x76c;
        }
      }
      else {
        lwDate = lwDate + 2000;
      }
    }
    else if (numOfDigits._4_4_ < 0) {
      lwDate = 1 - lwDate;
    }
    if (local_90 == 0) {
      if (lwZone == -0x80000000) {
        lwZone = 0;
      }
    }
    else {
      if (lwZone == -0x80000000) goto LAB_01072523;
      if ((lwZone < 0xa8c0) || (0xb6cf < lwZone)) {
        if (0 < local_90) {
          if (0xa8bf < lwZone) goto LAB_01072523;
          lwZone = lwZone + 0xa8c0;
        }
      }
      else if (local_90 < 0) {
        lwZone = lwZone + -0xa8c0;
      }
    }
    if (lwOffset == -0x80000000) {
      lwOffset = 0;
    }
    tBcAd._3_1_ = ss != -0x80000000;
    if ((bool)tBcAd._3_1_) {
      lwZone = lwZone + ss * -0x3c;
    }
    if (pszs._4_4_ != -0x80000000) {
      lwZone = lwZone + pszs._4_4_ * -0x3c;
    }
    temptempAllocator =
         (TempArenaAllocatorObject *)
         DateUtilities::TvFromDate
                   ((double)lwDate,(double)lwTime,(double)(lwMillisecond + -1),
                    (double)lwZone * 1000.0 + (double)lwOffset);
    puVar12 = _tAmPm;
    if ((tBcAd._3_1_ & 1) == 0) {
      temptempAllocator =
           (TempArenaAllocatorObject *)
           GetTvUtc<Js::ScriptContext>((double)temptempAllocator,(ScriptContext *)pchBase);
      puVar12 = _tAmPm;
    }
  }
LAB_01072523:
  _tAmPm = puVar12;
  ScriptContext::ReleaseTemporaryAllocator
            ((ScriptContext *)pchBase,(TempArenaAllocatorObject *)tempAllocator);
  (scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo =
       (_func_int **)temptempAllocator;
  return true;
LAB_01071a8f:
  tv = (double)((long)pcStack_40 - (long)pch >> 1);
  while( true ) {
    pszSrc._6_2_ = *pcStack_40;
    local_139 = false;
    if (pszSrc._6_2_ != L'\0') {
      local_13a = true;
      if (0x20 < (ushort)pszSrc._6_2_) {
        local_13a = CharClassifier::IsBiDirectionalChar(this,(uint)(ushort)pszSrc._6_2_);
      }
      local_139 = local_13a;
    }
    if (local_139 == false) break;
    pcStack_40 = pcStack_40 + 1;
  }
  switch((int)pszs) {
  case 2:
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                  ,0x50c,"(isNextFieldDateNegativeVersion5 == false)",
                                  "isNextFieldDateNegativeVersion5 == false");
      if (!bVar6) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    puVar12 = _tAmPm;
    if (0x3b < lwMonth) goto LAB_01072523;
    lwZone = lwMonth * 0x3c + lwZone;
    if (pszSrc._6_2_ == L':') {
      pcStack_40 = pcStack_40 + 1;
      local_154 = 2;
    }
    else {
      local_154 = 0;
    }
    pszs._0_4_ = local_154;
    pcVar11 = pcStack_40;
    break;
  case 3:
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                  ,0x516,"(isNextFieldDateNegativeVersion5 == false)",
                                  "isNextFieldDateNegativeVersion5 == false");
      if (!bVar6) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    puVar12 = _tAmPm;
    if (0x3b < lwMonth) goto LAB_01072523;
    lwZone = lwMonth + lwZone;
    if (pszSrc._6_2_ == L'.') {
      pcStack_40 = pcStack_40 + 1;
      local_158 = 3;
    }
    else {
      local_158 = 0;
    }
    pszs._0_4_ = local_158;
    pcVar11 = pcStack_40;
    break;
  case 4:
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                  ,0x520,"(isNextFieldDateNegativeVersion5 == false)",
                                  "isNextFieldDateNegativeVersion5 == false");
      if (!bVar6) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    if ((ulong)tv < 2) {
      lwOffset = lwMonth * 100;
    }
    else if ((ulong)tv < 3) {
      lwOffset = lwMonth * 10;
    }
    else if ((ulong)tv < 4) {
      lwOffset = lwMonth;
    }
    else {
      lwOffset = ((ushort)*pch - 0x30) * 100 + ((ushort)pch[1] - 0x30) * 10 +
                 ((ushort)pch[2] - 0x30);
    }
    pszs._0_4_ = 0;
    pcVar11 = pcStack_40;
    break;
  case 5:
  case 6:
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                  ,0x4fd,"(isNextFieldDateNegativeVersion5 == false)",
                                  "isNextFieldDateNegativeVersion5 == false");
      if (!bVar6) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    puVar12 = _tAmPm;
    if ((pszs._4_4_ != -0x80000000) || (lwZone == -0x80000000)) goto LAB_01072523;
    if (lwMonth < 0x18) {
      local_14c = lwMonth * 0x3c;
    }
    else {
      local_14c = lwMonth % 100 + (lwMonth / 100) * 0x3c;
    }
    pszs._4_4_ = local_14c;
    if ((int)pszs == 5) {
      pszs._4_4_ = -local_14c;
    }
    ss = 0;
    pszs._0_4_ = 0;
    pcVar11 = pcStack_40;
    break;
  case 7:
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                  ,0x53c,"(isNextFieldDateNegativeVersion5 == false)",
                                  "isNextFieldDateNegativeVersion5 == false");
      if (!bVar6) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    puVar12 = _tAmPm;
    if (lwMillisecond != -0x80000000) goto LAB_01072523;
    lwMillisecond = lwMonth;
    if ((lwDate == -0x80000000) && (bVar6 = FDateDelimiter(pszSrc._6_2_), bVar6)) {
      pszs._0_4_ = 8;
      pcVar11 = pcStack_40 + 1;
    }
    else {
      pszs._0_4_ = 0;
      pcVar11 = pcStack_40;
    }
    break;
  case 8:
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                  ,0x551,"(isNextFieldDateNegativeVersion5 == false)",
                                  "isNextFieldDateNegativeVersion5 == false");
      if (!bVar6) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    puVar12 = _tAmPm;
    if (lwTime != -0x80000000) goto LAB_01072523;
    lwTime = lwMonth + -1;
    bVar6 = FDateDelimiter(pszSrc._6_2_);
    pcVar11 = pcStack_40;
    if (bVar6) {
      pszs._0_4_ = 6;
      pcVar11 = pcStack_40 + 1;
    }
    break;
  default:
    puVar12 = _tAmPm;
    if (((0x45 < lwMonth) || (bVar5)) || (3 < (ulong)tv)) {
      if (lwDate != -0x80000000) goto LAB_01072523;
      if (bVar3) {
        local_15c = -lwMonth;
      }
      else {
        local_15c = lwMonth;
      }
      lwDate = local_15c;
      bVar5 = false;
      if ((lwMonth < 1000) && (3 < (ulong)tv)) {
        bVar4 = true;
      }
      bVar6 = FDateDelimiter(pszSrc._6_2_);
      pcVar11 = pcStack_40;
      if (bVar6) {
        pszs._0_4_ = 7;
        pcVar11 = pcStack_40 + 1;
      }
    }
    else if ((pszSrc._6_2_ == L'-') || (pszSrc._6_2_ == L'/')) {
      if (lwTime == -0x80000000) {
        lwTime = lwMonth + -1;
        pszs._0_4_ = 6;
      }
      else {
        if (lwDate != -0x80000000) goto LAB_01072523;
        lwMillisecond = lwMonth;
        bVar3 = true;
        bVar5 = true;
      }
      pcVar11 = pcStack_40 + 1;
    }
    else if (pszSrc._6_2_ == L':') {
      if ((lwZone != -0x80000000) || (0x17 < lwMonth)) goto LAB_01072523;
      lwZone = lwMonth * 0xe10;
      pszs._0_4_ = 1;
      pcVar11 = pcStack_40 + 1;
    }
    else {
      if (lwMillisecond != -0x80000000) goto LAB_01072523;
      lwMillisecond = lwMonth;
      pcVar11 = pcStack_40;
    }
  }
  goto LAB_01071496;
}

Assistant:

bool DateImplementation::UtcTimeFromStrCore(
        __in_ecount_z(ulength) const char16 *psz,
        unsigned int ulength,
        double &retVal,
        ScriptContext *const scriptContext)
    {
        Assert(scriptContext);

        if (ulength >= 0x7fffffff)
        {
            //Prevent unreasonable requests from causing overflows.
            return false;
        }

        if (nullptr == psz)
        {
            retVal = JavascriptNumber::NaN;
            return true;
        }

        // Try to parse the string as the ISO format first
        if(TryParseIsoString(psz, ulength, retVal, scriptContext))
        {
            return true;
        }

        enum
        {
            ssNil,
            ssMinutes,
            ssSeconds,
            ssMillisecond,
            ssAddOffset,
            ssSubOffset,
            ssDate,
            ssMonth,
            ssYear
        };

        char16 *pchBase;
        char16 *pch;
        char16 ch;
        char16 *pszSrc = nullptr;

        const int32 lwNil = 0x80000000;
        int32 cch;
        int32 depth;
        int32 lwT;
        int32 lwYear = lwNil;
        int32 lwMonth = lwNil;
        int32 lwDate = lwNil;
        int32 lwTime = lwNil;
        int32 lwMillisecond = lwNil;
        int32 lwZone = lwNil;
        int32 lwOffset = lwNil;

        int32 ss = ssNil;
        const SZS *pszs;

        bool fUtc;

        int tAmPm = 0;
        int tBcAd = 0;

        size_t numOfDigits = 0;
        double tv = JavascriptNumber::NaN; // Initialized for error handling.

        //Create a copy to analyze
        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("UtcTimeFromStr"));

        pszSrc = AnewArray(tempAllocator, char16, ulength + 1);

        size_t size = sizeof(char16) * (ulength + 1);
        js_memcpy_s(pszSrc, size, psz, size);

        _wcslwr_s(pszSrc,ulength+1);
        bool isDateNegativeVersion5 = false;
        bool isNextFieldDateNegativeVersion5 = false;
        bool isZeroPaddedYear = false;
        const Js::CharClassifier *classifier = scriptContext->GetCharClassifier();
        #pragma prefast(suppress: __WARNING_INCORRECT_VALIDATION, "pch is guaranteed to be null terminated by __in_z on psz and js_memcpy_s copying the null byte")
        for (pch = pszSrc; 0 != (ch = classifier->SkipBiDirectionalChars(pch));)
        {
            pch++;
            if (ch <= ' ')
            {
                continue;
            }

            switch (ch)
            {
                case '(':
                {
                    // skip stuff in parens
                    for (depth = 1; 0 != (ch = *pch); )
                    {
                        pch++;
                        if (ch == '(')
                        {
                            depth++;
                        }
                        else if (ch == ')' && --depth <= 0)
                        {
                            break;
                        }
                    }
                    continue;
                }
                case ',':
                case ':':
                case '/':
                {
                    // ignore these
                    continue;
                }
                case '+':
                case '-':
                {
                    if (lwNil == lwTime)
                    {
                        goto LError;
                    }
                    ss = (ch == '+') ? ssAddOffset : ssSubOffset;
                    continue;
                }
            }


            pchBase = pch - 1;
            if (!FBig(ch) && isalpha(ch))
            {
                for ( ; !FBig(*pch) && (isalpha(*pch) || '.' == *pch); pch++)
                    ;

                cch = (int32)(pch - pchBase);

                if ('.' == pchBase[cch - 1])
                {
                    cch--;
                }
                //Assert(cch > 0);

                // skip to the next real character
                while (0 != (*pch) && (*pch <= ' ' || classifier->IsBiDirectionalChar(*pch)))
                {
                    pch++;
                }

                // have an alphabetic token - look it up
                if (cch == 1)
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    // military version of time zone
                    // z = GMT
                    // j isn't used
                    // a to m are 1 to 12
                    // n to y are -1 to -12
                    if (lwNil != lwZone)
                    {
                        goto LError;
                    }
                    if (ch <= 'm')
                    {
                        if (ch == 'j' || ch < 'a')
                        {
                            goto LError;
                        }
                        lwZone = (int32)(ch - 'a' + (ch < 'j')) * 60;
                    }
                    else if (ch <= 'y')
                    {
                        lwZone = -(int32)(ch - 'm') * 60;
                    }
                    else if (ch == 'z')
                    {
                        lwZone = 0;
                    }
                    else
                    {
                        goto LError;
                    }

                    // look for a time zone offset
                    ss = ('+' == *pch) ? (pch++, ssAddOffset) :
                        ('-' == *pch) ? (pch++, ssSubOffset) : ssNil;
                    continue;
                }

                // look for a token
                for (pszs = g_rgszs + kcszs; ; )
                {
                    if (pszs-- <= g_rgszs)
                        goto LError;
                    if (cch <= pszs->cch &&
                        0 == memcmp(pchBase, pszs->psz, cch * sizeof(char16)))
                    {
                        break;
                    }
                }

                switch (pszs->szst)
                {
                    case ParseStringTokenType::BcAd:
                    {
                        if (tBcAd != 0)
                        {
                            goto LError;
                        }
                        tBcAd = (int)pszs->lwVal;
                        break;
                    }
                    case ParseStringTokenType::AmPm:
                    {
                        if (tAmPm != 0)
                        {
                            goto LError;
                        }
                        tAmPm = (int)pszs->lwVal;
                        break;
                    }
                    case ParseStringTokenType::Month:
                    {
                        if (lwNil != lwMonth)
                        {
                            goto LError;
                        }
                        lwMonth = pszs->lwVal;
                        if ('-' == *pch)
                        {
                            // handle the case date is negative for "Thu, 23 Sep -0007 00:00:00 GMT"
                            isDateNegativeVersion5 = true;
                            pch++;
                        }
                        break;
                    }
                    case ParseStringTokenType::Zone:
                    {
                        if (lwNil != lwZone)
                        {
                            goto LError;
                        }
                        lwZone = pszs->lwVal;

                        // look for a time zone offset
                        ss = ('+' == *pch) ? (pch++, ssAddOffset) :
                            ('-' == *pch) ? (pch++, ssSubOffset) : ssNil;
                        break;
                    }
                }
                continue;
            }

            if (FBig(ch) || !isdigit(ch))
            {
                goto LError;
            }

            for (lwT = ch - '0'; ; pch++)
            {
                // for time zone offset HH:mm, we already got HH so skip ':' and grab mm
                if (((ss == ssAddOffset) || (ss == ssSubOffset)) && (*pch == ':')) 
                {
                    continue;
                }
                if (FBig(*pch) || !isdigit(*pch))
                {
                    break;
                }
                // to avoid overflow
                if (pch - pchBase > 6)
                {
                    goto LError;
                }
                // convert string to number, e.g. 07:30 -> 730
                lwT = lwT * 10 + *pch - '0';
            }

            numOfDigits = pch - pchBase;
            // skip to the next real character
            while (0 != (ch = *pch) && (ch <= ' ' || classifier->IsBiDirectionalChar(ch)))
            {
                pch++;
            }

            switch (ss)
            {
                case ssAddOffset:
                case ssSubOffset:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwOffset || lwNil == lwTime)
                        goto LError;
                    // convert into minutes, e.g. 730 -> 7*60+30
                    lwOffset = lwT < 24 ? lwT * 60 :
                        (lwT % 100) + (lwT / 100) * 60;
                    if (ssSubOffset == ss)
                        lwOffset = -lwOffset;
                    lwZone = 0; // An offset is always with respect to UTC
                    ss = ssNil;
                    break;
                }
                case ssMinutes:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwT >= 60)
                        goto LError;
                    lwTime += lwT * 60;
                    ss = (ch == ':') ? (pch++, ssSeconds) : ssNil;
                    break;
                }
                case ssSeconds:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwT >= 60)
                        goto LError;
                    lwTime += lwT;
                    ss = (ch == '.') ? (pch++, ssMillisecond) : ssNil;
                    break;
                }
                case ssMillisecond:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (numOfDigits <= 1)
                    {
                        // 1 digit only, treat it as hundreds
                        lwMillisecond = lwT * 100;
                    }
                    else if (numOfDigits <= 2)
                    {
                        // 2 digit only, treat it as tens
                        lwMillisecond = lwT * 10;
                    }
                    else if (numOfDigits <= 3)
                    {
                        // canonical 3 digit, per EcmaScript spec
                        lwMillisecond = lwT;
                    }
                    else
                    {
                        // ignore any digits beyond the third
                        lwMillisecond = (pchBase[0] - '0') * 100 + (pchBase[1] - '0') * 10 + (pchBase[2] - '0');
                    }

                    ss = ssNil;
                    break;
                }
                case ssDate:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwDate)
                        goto LError;
                    lwDate = lwT;

                    if ((lwNil == lwYear) && FDateDelimiter(ch))
                    {
                        // We have already parsed the year if the date is specified as YYYY/MM/DD,
                        // but not when it is specified as MM/DD/YYYY.
                        ss = ssYear;
                        pch++;
                    }
                    else
                    {
                        ss = ssNil;
                    }
                    break;
                }
                case ssMonth:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwMonth)
                    {
                        goto LError;
                    }

                    lwMonth = lwT - 1;

                    if (FDateDelimiter(ch))
                    {
                        // Mark the next token as the date so that it won't be confused with another token.
                        // For example, if the next character is '-' as in "2015-1-1", then it'd be used as
                        // the time offset without this.
                        ss = ssDate;
                        pch++;
                    }

                    break;
                }
                case ssYear:
                {
                    AssertMsg(isNextFieldDateNegativeVersion5 == false, "isNextFieldDateNegativeVersion5 == false");

                    if (lwNil != lwYear)
                        goto LError;

                    AssertMsg(isDateNegativeVersion5 == false, "lwYear should be positive as pre-version:5 parsing");
                    lwYear = lwT;
                    ss = ssNil;
                    if (lwT < 1000 && numOfDigits >= 4)
                    {
                        isZeroPaddedYear = true;
                    }
                    break;
                }
                default:
                {
                    // assumptions for getting a YEAR:
                    //    - an absolute value greater or equal than 70 (thus not hour!)
                    //    - wasn't preceded by negative sign for -version:5 year format
                    //    - lwT has at least 4 digits (e.g. 0017 is year 17 AD)
                    if (lwT >= 70 || isNextFieldDateNegativeVersion5 || numOfDigits >= 4)
                    {
                        // assume it's a year - this is used particularly as version:5 year parsing
                        if (lwNil != lwYear)
                            goto LError;

                        // handle the case date is negative for "Tue Feb 02 -2012 01:02:03 GMT-0800"
                        lwYear = isDateNegativeVersion5 ? -lwT : lwT;
                        isNextFieldDateNegativeVersion5 = false;

                        if (lwT < 1000 && numOfDigits >= 4)
                        {
                            isZeroPaddedYear = true;
                        }

                        if (FDateDelimiter(ch))
                        {
                            // Mark the next token as the month so that it won't be confused with another token.
                            // For example, if the next character is '-' as in "2015-1-1", then it'd be used as
                            // the time offset without this.
                            ss = ssMonth;
                            pch++;
                        }

                        break;
                    }

                    switch (ch)
                    {
                        case ':':
                        {
                            // hour
                            if (lwNil != lwTime)
                                goto LError;
                            if (lwT >= 24)
                                goto LError;
                            lwTime = lwT * 3600;
                            ss = ssMinutes;
                            pch++;
                            break;
                        }
                        case '/':
                        case '-':
                        {
                            // month
                            if (lwNil != lwMonth)
                            {
                                // can be year
                                if (lwNil != lwYear)
                                {
                                    // both were already parsed!
                                    goto LError;
                                }
                                else
                                {
                                    // this is a day - with the negative sign for the date (version 5+)
                                    lwDate = lwT;
                                    isDateNegativeVersion5 = true;

                                    // mark the next field to be year (version 5+)
                                    isNextFieldDateNegativeVersion5 = true;
                                }
                            }
                            else
                            {
                                // this is a month
                                lwMonth = lwT - 1;
                                ss = ssDate;
                            }
                            pch++;
                            break;
                        }
                        default:
                        {
                            // date
                            if (lwNil != lwDate)
                                goto LError;
                            lwDate = lwT;
                            break;
                        }
                    }
                    break;
                }
            }
            continue;
        }

        if (lwNil == lwYear ||
            lwNil == lwMonth || lwMonth > 11 ||
            lwNil == lwDate || lwDate > 31)
        {
            goto LError;
        }

        if (tBcAd != 0)
        {
            if (tBcAd < 0)
            {
                // BC. Note that 1 BC is year 0 and 2 BC is year -1.
                lwYear = -lwYear + 1;
            }
        }
        else if (lwYear < 50 && isDateNegativeVersion5 == false && isZeroPaddedYear == false)
        {
            lwYear += 2000;
        }
        else if (lwYear < 100 && isDateNegativeVersion5 == false && isZeroPaddedYear == false)
        {
            lwYear += 1900;
        }


        if (tAmPm != 0)
        {
            if (lwNil == lwTime)
            {
                goto LError;
            }
            if (lwTime >= 12 * 3600L && lwTime < 13 * 3600L)
            {
                // In the 12:00 hour. AM means subtract 12 hours and PM means
                // do nothing.
                if (tAmPm < 0)
                {
                    lwTime -= 12 * 3600L;
                }
            }
            else
            {
                // Not in the 12:00 hour. AM means do nothing and PM means
                // add 12 hours.
                if (tAmPm > 0)
                {
                    if (lwTime >= 12 * 3600L)
                    {
                        goto LError;
                    }
                    lwTime += 12 * 3600L;
                }
            }
        }
        else if (lwNil == lwTime)
        {
            lwTime = 0;
        }

        if (lwNil == lwMillisecond)
        {
            lwMillisecond = 0;
        }

        if (lwNil != lwZone)
        {
            lwTime -= lwZone * 60;
            fUtc = TRUE;
        }
        else
        {
            fUtc = FALSE;
        }
        if (lwNil != lwOffset)
        {
            lwTime -= lwOffset * 60;
        }

        // Rebuild time.
        tv = TvFromDate(lwYear, lwMonth, lwDate - 1, (double)lwTime * 1000 + lwMillisecond);
        if (!fUtc)
        {
            tv = GetTvUtc(tv, scriptContext);
        }

LError:
        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);
        retVal = tv;
        return true;
    }